

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O2

void __thiscall
SuiteParserTests::extractLengthFixture::extractLengthFixture(extractLengthFixture *this)

{
  (this->normalLength)._M_dataplus._M_p = (pointer)&(this->normalLength).field_2;
  (this->normalLength)._M_string_length = 0;
  (this->normalLength).field_2._M_local_buf[0] = '\0';
  (this->badLength)._M_dataplus._M_p = (pointer)&(this->badLength).field_2;
  (this->badLength)._M_string_length = 0;
  (this->badLength).field_2._M_local_buf[0] = '\0';
  (this->negativeLength)._M_dataplus._M_p = (pointer)&(this->negativeLength).field_2;
  (this->negativeLength)._M_string_length = 0;
  (this->negativeLength).field_2._M_local_buf[0] = '\0';
  (this->incomplete_1)._M_dataplus._M_p = (pointer)&(this->incomplete_1).field_2;
  (this->incomplete_1)._M_string_length = 0;
  (this->incomplete_1).field_2._M_local_buf[0] = '\0';
  (this->incomplete_2)._M_dataplus._M_p = (pointer)&(this->incomplete_2).field_2;
  (this->incomplete_2)._M_string_length = 0;
  (this->incomplete_2).field_2._M_local_buf[0] = '\0';
  (this->object).m_buffer._M_dataplus._M_p = (pointer)&(this->object).m_buffer.field_2;
  (this->object).m_buffer._M_string_length = 0;
  (this->object).m_buffer.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->badLength);
  std::__cxx11::string::assign((char *)&this->negativeLength);
  std::__cxx11::string::assign((char *)&this->incomplete_1);
  std::__cxx11::string::assign((char *)&this->incomplete_2);
  return;
}

Assistant:

extractLengthFixture()
  {
    normalLength   = "8=FIX.4.2\0019=12\00135=A\001108=30\00110=31\001";
    badLength      = "8=FIX.4.2\0019=A\00135=A\001108=30\00110=31\001";
    negativeLength = "8=FIX.4.2\0019=-1\00135=A\001108=30\00110=31\001";
    incomplete_1   = "8=FIX.4.2";
    incomplete_2   = "8=FIX.4.2\0019=12";
  }